

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::PhpGetterTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          Options *options)

{
  bool bVar1;
  Type TVar2;
  Descriptor *desc;
  char *pcVar3;
  string sStack_38;
  
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)this);
  if (bVar1) {
    pcVar3 = "\\Google\\Protobuf\\Internal\\MapField";
  }
  else if ((~(byte)this[1] & 0x60) == 0) {
    pcVar3 = "\\Google\\Protobuf\\Internal\\RepeatedField";
  }
  else {
    TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
    switch(TVar2) {
    case TYPE_DOUBLE:
    case TYPE_FLOAT:
      pcVar3 = "float";
      break;
    case TYPE_INT64:
    case TYPE_UINT64:
    case TYPE_FIXED64:
    case TYPE_SFIXED64:
    case MAX_TYPE:
      pcVar3 = "int|string";
      break;
    case TYPE_INT32:
    case TYPE_FIXED32:
    case TYPE_UINT32:
    case TYPE_ENUM:
    case TYPE_SFIXED32:
    case TYPE_SINT32:
      pcVar3 = "int";
      break;
    case TYPE_BOOL:
      pcVar3 = "bool";
      break;
    case TYPE_STRING:
    case TYPE_BYTES:
      pcVar3 = "string";
      break;
    case TYPE_GROUP:
      pcVar3 = "null";
      break;
    case TYPE_MESSAGE:
      desc = FieldDescriptor::message_type((FieldDescriptor *)this);
      anon_unknown_2::FullClassName<google::protobuf::Descriptor>(&sStack_38,desc,(Options *)field);
      std::operator+(__return_storage_ptr__,"\\",&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
      return __return_storage_ptr__;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                    ,0x216,
                    "std::string google::protobuf::compiler::php::(anonymous namespace)::PhpGetterTypeName(const FieldDescriptor *, const Options &)"
                   );
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string PhpGetterTypeName(const FieldDescriptor* field,
                              const Options& options) {
  if (field->is_map()) {
    return "\\Google\\Protobuf\\Internal\\MapField";
  }
  if (field->is_repeated()) {
    return "\\Google\\Protobuf\\Internal\\RepeatedField";
  }
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_ENUM: return "int";
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED64: return "int|string";
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT: return "float";
    case FieldDescriptor::TYPE_BOOL: return "bool";
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: return "string";
    case FieldDescriptor::TYPE_MESSAGE:
      return "\\" + FullClassName(field->message_type(), options);
    case FieldDescriptor::TYPE_GROUP: return "null";
    default: assert(false); return "";
  }
}